

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcOccupant::IfcOccupant(IfcOccupant *this)

{
  IfcOccupant *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x120,"IfcOccupant");
  IfcActor::IfcActor(&this->super_IfcActor,&PTR_construction_vtable_24__00f7abd0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcOccupant,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcOccupant,_1UL> *)
             &(this->super_IfcActor).field_0xf0,&PTR_construction_vtable_24__00f7ac80);
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject = 0xf7aaf0;
  *(undefined8 *)&this->field_0x120 = 0xf7abb8;
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject.field_0x88 = 0xf7ab18;
  (this->super_IfcActor).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)0xf7ab40;
  *(undefined8 *)&(this->super_IfcActor).super_IfcObject.field_0xd0 = 0xf7ab68;
  *(undefined8 *)&(this->super_IfcActor).field_0xf0 = 0xf7ab90;
  std::__cxx11::string::string((string *)&(this->super_IfcActor).field_0x100);
  return;
}

Assistant:

IfcOccupant() : Object("IfcOccupant") {}